

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::remove_bits(symbol_codec *this,uint num_bits)

{
  byte *pbVar1;
  int in_ESI;
  long *in_RDI;
  uint c;
  uint local_10;
  
  if (in_ESI != 0) {
    while (*(int *)((long)in_RDI + 0x3c) < in_ESI) {
      local_10 = 0;
      if (in_RDI[1] == in_RDI[2]) {
        if ((*(byte *)(in_RDI + 4) & 1) == 0) {
          (*(code *)in_RDI[5])(in_RDI[1] - *in_RDI,in_RDI[6],in_RDI,in_RDI + 3,in_RDI + 4);
          in_RDI[2] = *in_RDI + in_RDI[3];
          in_RDI[1] = *in_RDI;
          if ((ulong)in_RDI[1] < (ulong)in_RDI[2]) {
            pbVar1 = (byte *)in_RDI[1];
            in_RDI[1] = (long)(pbVar1 + 1);
            local_10 = (uint)*pbVar1;
          }
        }
      }
      else {
        pbVar1 = (byte *)in_RDI[1];
        in_RDI[1] = (long)(pbVar1 + 1);
        local_10 = (uint)*pbVar1;
      }
      *(int *)((long)in_RDI + 0x3c) = *(int *)((long)in_RDI + 0x3c) + 8;
      *(uint *)(in_RDI + 7) =
           local_10 << (0x20U - (char)*(undefined4 *)((long)in_RDI + 0x3c) & 0x1f) |
           *(uint *)(in_RDI + 7);
    }
    *(int *)(in_RDI + 7) = (int)in_RDI[7] << ((byte)in_ESI & 0x1f);
    *(int *)((long)in_RDI + 0x3c) = *(int *)((long)in_RDI + 0x3c) - in_ESI;
  }
  return;
}

Assistant:

void symbol_codec::remove_bits(uint num_bits) {
  CRNLIB_ASSERT(num_bits <= 25);

  if (!num_bits)
    return;

  while (m_bit_count < (int)num_bits) {
    uint c = 0;
    if (m_pDecode_buf_next == m_pDecode_buf_end) {
      if (!m_decode_buf_eof) {
        m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
        m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
        m_pDecode_buf_next = m_pDecode_buf;
        if (m_pDecode_buf_next < m_pDecode_buf_end)
          c = *m_pDecode_buf_next++;
      }
    } else
      c = *m_pDecode_buf_next++;

    m_bit_count += 8;
    CRNLIB_ASSERT(m_bit_count <= cBitBufSize);

    m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
  }

  m_bit_buf <<= num_bits;
  m_bit_count -= num_bits;
}